

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_async_function_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,int flags
                  )

{
  list_head *plVar1;
  JSRuntime *pJVar2;
  list_head *plVar3;
  int iVar4;
  JSAsyncFunctionData *s;
  ulong uVar5;
  JSValueUnion JVar6;
  ulong uVar7;
  int64_t iVar8;
  JSValue JVar9;
  
  s = (JSAsyncFunctionData *)js_mallocz(ctx,0xa8);
  iVar8 = 6;
  uVar5 = 0;
  if (s == (JSAsyncFunctionData *)0x0) {
    uVar7 = 0;
  }
  else {
    (s->header).ref_count = 1;
    pJVar2 = ctx->rt;
    (s->header).field_0x4 = 4;
    plVar1 = &(s->header).link;
    plVar3 = (pJVar2->gc_obj_list).prev;
    plVar3->next = plVar1;
    (s->header).link.prev = plVar3;
    (s->header).link.next = &pJVar2->gc_obj_list;
    (pJVar2->gc_obj_list).prev = plVar1;
    s->is_active = 0;
    s->resolving_funcs[0].u.int32 = 0;
    s->resolving_funcs[0].tag = 3;
    s->resolving_funcs[1].u.int32 = 0;
    s->resolving_funcs[1].tag = 3;
    JVar9 = js_new_promise_capability(ctx,s->resolving_funcs,(JSValue)(ZEXT816(3) << 0x40));
    iVar8 = JVar9.tag;
    JVar6 = JVar9.u;
    if ((uint)JVar9.tag != 6) {
      iVar4 = async_func_init(ctx,&s->func_state,func_obj,this_obj,argc,argv);
      if (iVar4 == 0) {
        s->is_active = 1;
        js_async_function_resume(ctx,s);
        js_async_function_free(ctx->rt,s);
        uVar7 = (ulong)JVar6.ptr & 0xffffffff00000000;
        uVar5 = (ulong)JVar6.ptr & 0xffffffff;
        goto LAB_00131c9c;
      }
    }
    if ((0xfffffff4 < (uint)JVar9.tag) &&
       (iVar4 = *JVar6.ptr, *(int *)JVar6.ptr = iVar4 + -1, iVar4 < 2)) {
      __JS_FreeValueRT(ctx->rt,JVar9);
    }
    js_async_function_free(ctx->rt,s);
    uVar5 = 0;
    uVar7 = 0;
    iVar8 = 6;
  }
LAB_00131c9c:
  JVar9.u.ptr = (void *)(uVar5 | uVar7);
  JVar9.tag = iVar8;
  return JVar9;
}

Assistant:

static JSValue js_async_function_call(JSContext *ctx, JSValueConst func_obj,
                                      JSValueConst this_obj,
                                      int argc, JSValueConst *argv, int flags)
{
    JSValue promise;
    JSAsyncFunctionData *s;

    s = js_mallocz(ctx, sizeof(*s));
    if (!s)
        return JS_EXCEPTION;
    s->header.ref_count = 1;
    add_gc_object(ctx->rt, &s->header, JS_GC_OBJ_TYPE_ASYNC_FUNCTION);
    s->is_active = FALSE;
    s->resolving_funcs[0] = JS_UNDEFINED;
    s->resolving_funcs[1] = JS_UNDEFINED;

    promise = JS_NewPromiseCapability(ctx, s->resolving_funcs);
    if (JS_IsException(promise))
        goto fail;

    if (async_func_init(ctx, &s->func_state, func_obj, this_obj, argc, argv)) {
    fail:
        JS_FreeValue(ctx, promise);
        js_async_function_free(ctx->rt, s);
        return JS_EXCEPTION;
    }
    s->is_active = TRUE;

    js_async_function_resume(ctx, s);

    js_async_function_free(ctx->rt, s);

    return promise;
}